

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RepulsivePower.cpp
# Opt level: O0

void __thiscall OpenMD::RepulsivePower::calcForce(RepulsivePower *this,InteractionData *idat)

{
  double dVar1;
  double dVar2;
  reference pvVar3;
  reference this_00;
  reference pvVar4;
  double *pdVar5;
  int *in_RSI;
  RealType *in_RDI;
  Vector<double,_3U> *pVVar6;
  RealType dudr;
  RealType pot_temp;
  RealType myDerivC;
  RealType myDeriv;
  RealType myPotC;
  RealType myPot;
  RealType rcos;
  RealType ros;
  int nRep;
  RealType epsilon;
  RealType sigmai;
  RPInteractionData *mixer;
  RepulsivePower *in_stack_00000170;
  Vector<double,_3U> *in_stack_ffffffffffffff28;
  Vector<double,_3U> *in_stack_ffffffffffffff30;
  Vector<double,_3U> *v1;
  RealType *in_stack_ffffffffffffff40;
  Vector<double,_3U> *pVVar7;
  vector<std::vector<OpenMD::RPInteractionData,_std::allocator<OpenMD::RPInteractionData>_>,_std::allocator<std::vector<OpenMD::RPInteractionData,_std::allocator<OpenMD::RPInteractionData>_>_>_>
  *this_01;
  RepulsivePower *in_stack_ffffffffffffff60;
  double local_50;
  
  if (((ulong)in_RDI[1] & 1) == 0) {
    initialize(in_stack_00000170);
  }
  this_01 = (vector<std::vector<OpenMD::RPInteractionData,_std::allocator<OpenMD::RPInteractionData>_>,_std::allocator<std::vector<OpenMD::RPInteractionData,_std::allocator<OpenMD::RPInteractionData>_>_>_>
             *)(in_RDI + 0xb);
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 8),(long)*in_RSI);
  this_00 = std::
            vector<std::vector<OpenMD::RPInteractionData,_std::allocator<OpenMD::RPInteractionData>_>,_std::allocator<std::vector<OpenMD::RPInteractionData,_std::allocator<OpenMD::RPInteractionData>_>_>_>
            ::operator[](this_01,(long)*pvVar3);
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 8),(long)in_RSI[1]);
  pvVar4 = std::vector<OpenMD::RPInteractionData,_std::allocator<OpenMD::RPInteractionData>_>::
           operator[](this_00,(long)*pvVar3);
  dVar1 = pvVar4->sigmai;
  dVar2 = pvVar4->epsilon;
  local_50 = 0.0;
  getNRepulsionFunc(in_stack_ffffffffffffff60,in_RDI,(int *)this_00,(RealType *)this_01,
                    in_stack_ffffffffffffff40);
  if ((*(byte *)(in_RSI + 0xe) & 1) == 0) {
    if ((*(byte *)((long)in_RSI + 0x39) & 1) == 0) {
      local_50 = 0.0;
    }
    else {
      getNRepulsionFunc(in_stack_ffffffffffffff60,in_RDI,(int *)this_00,(RealType *)this_01,
                        in_stack_ffffffffffffff40);
      local_50 = (*(double *)(in_RSI + 8) - *(double *)(in_RSI + 0xc)) * 0.0 * dVar1 + 0.0;
    }
  }
  else {
    getNRepulsionFunc(in_stack_ffffffffffffff60,in_RDI,(int *)this_00,(RealType *)this_01,
                      in_stack_ffffffffffffff40);
  }
  pVVar6 = (Vector<double,_3U> *)(*(double *)(in_RSI + 0x14) * dVar2 * (0.0 - local_50));
  *(double *)(in_RSI + 0x34) = (double)pVVar6 + *(double *)(in_RSI + 0x34);
  v1 = *(Vector<double,_3U> **)(in_RSI + 0x10);
  pVVar7 = pVVar6;
  pdVar5 = Vector<double,_7U>::operator[]((Vector<double,_7U> *)(in_RSI + 0x18),1);
  *pdVar5 = (double)v1 * (double)pVVar7 + *pdVar5;
  if ((*(byte *)((long)in_RSI + 0xdb) & 1) != 0) {
    in_stack_ffffffffffffff28 = *(Vector<double,_3U> **)(in_RSI + 0x10);
    pdVar5 = Vector<double,_7U>::operator[]((Vector<double,_7U> *)(in_RSI + 0x38),1);
    *pdVar5 = (double)in_stack_ffffffffffffff28 * (double)pVVar6 + *pdVar5;
    in_stack_ffffffffffffff30 = pVVar6;
  }
  OpenMD::operator*(v1,(double)in_stack_ffffffffffffff30);
  operator/(v1,(double)in_stack_ffffffffffffff30);
  Vector<double,_3U>::operator+=(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  return;
}

Assistant:

void RepulsivePower::calcForce(InteractionData& idat) {
    if (!initialized_) initialize();

    RPInteractionData& mixer =
        MixingMap[RPtids[idat.atid1]][RPtids[idat.atid2]];
    RealType sigmai  = mixer.sigmai;
    RealType epsilon = mixer.epsilon;
    int nRep         = mixer.nRep;

    RealType ros;
    RealType rcos;
    RealType myPot    = 0.0;
    RealType myPotC   = 0.0;
    RealType myDeriv  = 0.0;
    RealType myDerivC = 0.0;

    ros = idat.rij * sigmai;

    getNRepulsionFunc(ros, nRep, myPot, myDeriv);

    if (idat.shiftedPot) {
      rcos = idat.rcut * sigmai;
      getNRepulsionFunc(rcos, nRep, myPotC, myDerivC);
      myDerivC = 0.0;
    } else if (idat.shiftedForce) {
      rcos = idat.rcut * sigmai;
      getNRepulsionFunc(rcos, nRep, myPotC, myDerivC);
      myPotC = myPotC + myDerivC * (idat.rij - idat.rcut) * sigmai;
    } else {
      myPotC   = 0.0;
      myDerivC = 0.0;
    }

    RealType pot_temp = idat.vdwMult * epsilon * (myPot - myPotC);
    idat.vpair += pot_temp;

    RealType dudr =
        idat.sw * idat.vdwMult * epsilon * (myDeriv - myDerivC) * sigmai;

    idat.pot[VANDERWAALS_FAMILY] += idat.sw * pot_temp;
    if (idat.isSelected) idat.selePot[VANDERWAALS_FAMILY] += idat.sw * pot_temp;

    idat.f1 += idat.d * dudr / idat.rij;

    return;
  }